

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O3

arith_uint256 * __thiscall
anon_unknown.dwarf_2e8cd18::PeerManagerImpl::GetAntiDoSWorkThreshold
          (arith_uint256 *__return_storage_ptr__,PeerManagerImpl *this)

{
  pointer ppCVar1;
  CBlockIndex *block;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int iVar5;
  Chainstate *pCVar6;
  base_uint<256U> *pbVar7;
  _Storage<arith_uint256,_true> *b;
  arith_uint256 *b_00;
  arith_uint256 *this_00;
  _Storage<arith_uint256,_true> *p_Var8;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock59;
  unique_lock<std::recursive_mutex> local_f8;
  base_uint<256U> local_e8;
  uint32_t local_c8 [2];
  uint32_t auStack_c0 [2];
  uint32_t local_b8 [2];
  uint32_t auStack_b0 [2];
  arith_uint256 local_a8;
  undefined8 local_78;
  undefined8 uStack_70;
  _Storage<arith_uint256,_true> local_68;
  base_uint<256U> local_48;
  arith_uint256 *local_28;
  
  local_28 = *(arith_uint256 **)(in_FS_OFFSET + 0x28);
  local_68._16_8_ = 0;
  local_68._24_8_ = 0;
  local_68._0_8_ = 0;
  local_68._8_8_ = 0;
  local_f8._M_device = &cs_main.super_recursive_mutex;
  local_f8._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_f8);
  pCVar6 = ChainstateManager::ActiveChainstate(this->m_chainman);
  ppCVar1 = (pCVar6->m_chain).vChain.
            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if ((ppCVar1 !=
       (pCVar6->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
       _M_impl.super__Vector_impl_data._M_start) && (ppCVar1[-1] != (CBlockIndex *)0x0)) {
    pCVar6 = ChainstateManager::ActiveChainstate(this->m_chainman);
    block = (pCVar6->m_chain).vChain.
            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Vector_impl_data._M_finish[-1];
    GetBlockProof((arith_uint256 *)&local_e8,block);
    local_48.pn[0] = 0x90;
    local_48.pn[1] = 0;
    local_48.pn[2] = 0;
    local_48.pn[3] = 0;
    local_48.pn[4] = 0;
    local_48.pn[5] = 0;
    local_48.pn[6] = 0;
    local_48.pn[7] = 0;
    pbVar7 = base_uint<256U>::operator*=(&local_48,&local_e8);
    this_00 = &block->nChainWork;
    local_c8 = *(uint32_t (*) [2])pbVar7->pn;
    auStack_c0 = *(uint32_t (*) [2])(pbVar7->pn + 2);
    local_b8 = *(uint32_t (*) [2])(pbVar7->pn + 4);
    auStack_b0 = *(uint32_t (*) [2])(pbVar7->pn + 6);
    local_a8.super_base_uint<256U>.pn._0_8_ = local_c8;
    local_a8.super_base_uint<256U>.pn._8_8_ = auStack_c0;
    local_a8.super_base_uint<256U>.pn._16_8_ = local_b8;
    local_a8.super_base_uint<256U>.pn._24_8_ = auStack_b0;
    iVar5 = base_uint<256U>::CompareTo
                      (&this_00->super_base_uint<256U>,&local_a8.super_base_uint<256U>);
    b_00 = &local_a8;
    if (iVar5 < 0) {
      b_00 = this_00;
    }
    uVar2 = *(undefined8 *)(this_00->super_base_uint<256U>).pn;
    uVar3 = *(undefined8 *)((block->nChainWork).super_base_uint<256U>.pn + 2);
    uVar4 = *(undefined8 *)((block->nChainWork).super_base_uint<256U>.pn + 4);
    local_48.pn._24_8_ = *(undefined8 *)((block->nChainWork).super_base_uint<256U>.pn + 6);
    local_48.pn[4] = (uint32_t)uVar4;
    local_48.pn[5] = (uint32_t)((ulong)uVar4 >> 0x20);
    local_48.pn[0] = (uint32_t)uVar2;
    local_48.pn[1] = (uint32_t)((ulong)uVar2 >> 0x20);
    local_48.pn[2] = (uint32_t)uVar3;
    local_48.pn[3] = (uint32_t)((ulong)uVar3 >> 0x20);
    pbVar7 = base_uint<256U>::operator-=(&local_48,&b_00->super_base_uint<256U>);
    local_68._0_8_ = *(undefined8 *)pbVar7->pn;
    local_68._8_8_ = *(undefined8 *)(pbVar7->pn + 2);
    local_78 = *(undefined8 *)(pbVar7->pn + 4);
    uStack_70 = *(undefined8 *)(pbVar7->pn + 6);
    local_68._16_8_ = local_78;
    local_68._24_8_ = uStack_70;
  }
  b = (_Storage<arith_uint256,_true> *)
      inline_assertion_check<true,std::optional<arith_uint256>const&>
                (&(this->m_chainman->m_options).minimum_chain_work,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.h"
                 ,0x3d3,"MinimumChainWork","m_options.minimum_chain_work");
  iVar5 = base_uint<256U>::CompareTo
                    (&local_68._M_value.super_base_uint<256U>,&(b->_M_value).super_base_uint<256U>);
  p_Var8 = &local_68;
  if (iVar5 < 0) {
    p_Var8 = b;
  }
  uVar2 = *(undefined8 *)
           &(((_Optional_base<arith_uint256,_false,_false> *)
             &(p_Var8->_M_value).super_base_uint<256U>)->_M_payload).
            super__Optional_payload_base<arith_uint256>._M_payload;
  uVar3 = *(undefined8 *)
           ((long)&(((_Optional_base<arith_uint256,_false,_false> *)
                    &(p_Var8->_M_value).super_base_uint<256U>)->_M_payload).
                   super__Optional_payload_base<arith_uint256>._M_payload + 8);
  uVar4 = *(undefined8 *)
           ((long)&(((_Optional_base<arith_uint256,_false,_false> *)
                    &(p_Var8->_M_value).super_base_uint<256U>)->_M_payload).
                   super__Optional_payload_base<arith_uint256>._M_payload + 0x18);
  *(undefined8 *)((__return_storage_ptr__->super_base_uint<256U>).pn + 4) =
       *(undefined8 *)
        ((long)&(((_Optional_base<arith_uint256,_false,_false> *)
                 &(p_Var8->_M_value).super_base_uint<256U>)->_M_payload).
                super__Optional_payload_base<arith_uint256>._M_payload + 0x10);
  *(undefined8 *)((__return_storage_ptr__->super_base_uint<256U>).pn + 6) = uVar4;
  *(undefined8 *)(__return_storage_ptr__->super_base_uint<256U>).pn = uVar2;
  *(undefined8 *)((__return_storage_ptr__->super_base_uint<256U>).pn + 2) = uVar3;
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_f8);
  if (*(arith_uint256 **)(in_FS_OFFSET + 0x28) == local_28) {
    return *(arith_uint256 **)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

arith_uint256 PeerManagerImpl::GetAntiDoSWorkThreshold()
{
    arith_uint256 near_chaintip_work = 0;
    LOCK(cs_main);
    if (m_chainman.ActiveChain().Tip() != nullptr) {
        const CBlockIndex *tip = m_chainman.ActiveChain().Tip();
        // Use a 144 block buffer, so that we'll accept headers that fork from
        // near our tip.
        near_chaintip_work = tip->nChainWork - std::min<arith_uint256>(144*GetBlockProof(*tip), tip->nChainWork);
    }
    return std::max(near_chaintip_work, m_chainman.MinimumChainWork());
}